

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FAT.cpp
# Opt level: O0

optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> *
Storage::Disk::FAT::GetFile
          (optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
           *__return_storage_ptr__,shared_ptr<Storage::Disk::Disk> *disk,Volume *volume,File *file)

{
  bool bVar1;
  int iVar2;
  Sector *pSVar3;
  const_reference pvVar4;
  size_type sVar5;
  const_iterator __first;
  const_iterator __last;
  back_insert_iterator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> __result;
  const_reference pvVar6;
  CHS CVar7;
  Sector *sector_contents;
  int local_a0;
  int iStack_9c;
  CHS address;
  int c;
  int sector;
  uint16_t cluster;
  vector<unsigned_char,_std::allocator<unsigned_char>_> contents;
  Parser parser;
  File *file_local;
  Volume *volume_local;
  shared_ptr<Storage::Disk::Disk> *disk_local;
  
  Encodings::MFM::Parser::Parser
            ((Parser *)
             &contents.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,Double,disk);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&sector);
  c._2_2_ = file->starting_cluster;
  do {
    iVar2 = Volume::sector_for_cluster(volume,c._2_2_);
    for (address.head = 0; address.head < (int)(uint)volume->sectors_per_cluster;
        address.head = address.head + 1) {
      CVar7 = Volume::chs_for_sector(volume,iVar2 + address.head);
      local_a0 = CVar7.cylinder;
      iStack_9c = CVar7.head;
      address.cylinder._0_1_ = (uint8_t)CVar7.sector;
      pSVar3 = Encodings::MFM::Parser::sector
                         ((Parser *)
                          &contents.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_end_of_storage,iStack_9c,local_a0,
                          (uint8_t)address.cylinder);
      if (pSVar3 == (Sector *)0x0) {
LAB_00994d83:
        std::optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>::optional
                  (__return_storage_ptr__);
        goto LAB_00994ec8;
      }
      bVar1 = std::
              vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
              ::empty(&pSVar3->samples);
      if (bVar1) goto LAB_00994d83;
      pvVar4 = std::
               vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
               ::operator[](&pSVar3->samples,0);
      sVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(pvVar4);
      if (sVar5 != volume->bytes_per_sector) goto LAB_00994d83;
      pvVar4 = std::
               vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
               ::operator[](&pSVar3->samples,0);
      __first = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin(pvVar4);
      pvVar4 = std::
               vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
               ::operator[](&pSVar3->samples,0);
      __last = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end(pvVar4);
      __result = std::back_inserter<std::vector<unsigned_char,std::allocator<unsigned_char>>>
                           ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&sector);
      std::
      copy<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::back_insert_iterator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                ((__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                  )__first._M_current,
                 (__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                  )__last._M_current,__result);
    }
    pvVar6 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator[]
                       (&volume->fat,(ulong)c._2_2_);
    c._2_2_ = *pvVar6;
    if (0xfef < c._2_2_) {
      std::optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>::
      optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_true>
                (__return_storage_ptr__,
                 (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&sector);
LAB_00994ec8:
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&sector);
      Encodings::MFM::Parser::~Parser
                ((Parser *)
                 &contents.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                  .super__Vector_impl_data._M_end_of_storage);
      return __return_storage_ptr__;
    }
  } while( true );
}

Assistant:

std::optional<std::vector<uint8_t>> FAT::GetFile(const std::shared_ptr<Storage::Disk::Disk> &disk, const Volume &volume, const File &file) {
	Storage::Encodings::MFM::Parser parser(Storage::Encodings::MFM::Density::Double, disk);

	std::vector<uint8_t> contents;

	// In FAT cluster numbers describe a linked list via the FAT table, with values above $FF0 being reserved
	// (relevantly: FF7 means bad cluster; FF8–FFF mean end-of-file).
	uint16_t cluster = file.starting_cluster;
	do {
		const int sector = volume.sector_for_cluster(cluster);

		for(int c = 0; c < volume.sectors_per_cluster; c++) {
			const auto address = volume.chs_for_sector(sector + c);

			const Storage::Encodings::MFM::Sector *const sector_contents =
				parser.sector(address.head, address.cylinder, uint8_t(address.sector));
			if(!sector_contents || sector_contents->samples.empty() || sector_contents->samples[0].size() != volume.bytes_per_sector) {
				return std::nullopt;
			}
			std::copy(sector_contents->samples[0].begin(), sector_contents->samples[0].end(), std::back_inserter(contents));
		}

		cluster = volume.fat[cluster];
	} while(cluster < 0xff0);

	return contents;
}